

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2ConsumeN(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int n;
  Arg *args [2];
  StringPiece input;
  string word;
  string s;
  int local_21c;
  Arg *local_218;
  int **local_210;
  StringPiece local_208;
  Arg local_1f8;
  int *local_1e8;
  code *local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  char *local_1b8;
  int local_1b0;
  char local_1a8 [16];
  LogMessage local_198;
  
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8," one two three 4","");
  local_208.ptr_ = local_1b8;
  local_208.length_ = local_1b0;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&local_1f8.arg_ + lVar3) = 0;
    *(code **)((long)&local_1f8.parser_ + lVar3) = RE2::Arg::parse_null;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x20);
  local_218 = &local_1f8;
  local_210 = &local_1e8;
  RE2::RE2((RE2 *)&local_198,"\\s*(\\w+)");
  bVar1 = RE2::ConsumeN(&local_208,(RE2 *)&local_198,&local_218,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xfc,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,
               "Check failed: RE2::ConsumeN(&input, \"\\\\s*(\\\\w+)\", args, 0)",0x3a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  local_1d0 = 0;
  local_1c8[0] = 0;
  local_1f8.arg_ = &local_1d8;
  local_1f8.parser_ = RE2::Arg::parse_string;
  local_1d8 = local_1c8;
  RE2::RE2((RE2 *)&local_198,"\\s*(\\w+)");
  bVar1 = RE2::ConsumeN(&local_208,(RE2 *)&local_198,&local_218,1);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x101,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,
               "Check failed: RE2::ConsumeN(&input, \"\\\\s*(\\\\w+)\", args, 1)",0x3a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_1d8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x102,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: (\"two\") == (word)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  local_1e8 = &local_21c;
  local_1e0 = RE2::Arg::parse_int;
  RE2::RE2((RE2 *)&local_198,"\\s*(\\w+)\\s*(\\d+)");
  bVar1 = RE2::ConsumeN(&local_208,(RE2 *)&local_198,&local_218,2);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x107,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,
               "Check failed: RE2::ConsumeN(&input, \"\\\\s*(\\\\w+)\\\\s*(\\\\d+)\", args, 2)",0x44
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_1d8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x108,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: (\"three\") == (word)",0x21);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if (local_21c != 4) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x109,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: (4) == (n)",0x18);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}